

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::ScopedTrace::PushTrace(ScopedTrace *this,char *file,int line,string *message)

{
  UnitTest *this_00;
  undefined1 local_58 [8];
  TraceInfo trace;
  string *message_local;
  int line_local;
  char *file_local;
  ScopedTrace *this_local;
  
  trace.message.field_2._8_8_ = message;
  internal::TraceInfo::TraceInfo((TraceInfo *)local_58);
  local_58 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&trace.line,
             message);
  this_00 = UnitTest::GetInstance();
  UnitTest::PushGTestTrace(this_00,(TraceInfo *)local_58);
  internal::TraceInfo::~TraceInfo((TraceInfo *)local_58);
  return;
}

Assistant:

void ScopedTrace::PushTrace(const char* file, int line, std::string message) {
  internal::TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message.swap(message);

  UnitTest::GetInstance()->PushGTestTrace(trace);
}